

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
::ClassId(TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZStackEqnStorage<std::complex<float>_> *in_RDI;
  allocator<char> *in_stack_fffffffffffe04d0;
  char *in_stack_fffffffffffe04d8;
  TPZStackEqnStorage<std::complex<float>_> *in_stack_fffffffffffe04e0;
  TPZFrontNonSym<std::complex<float>_> *in_stack_fffffffffffe04f0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffe04e0,in_stack_fffffffffffe04d8,in_stack_fffffffffffe04d0);
  uVar1 = Hash((string *)in_RDI);
  iVar2 = TPZAbstractFrontMatrix<std::complex<float>_>::ClassId
                    ((TPZAbstractFrontMatrix<std::complex<float>_> *)in_stack_fffffffffffe04f0);
  uVar1 = uVar1 ^ iVar2 * 2;
  TPZStackEqnStorage<std::complex<float>_>::TPZStackEqnStorage(in_RDI);
  iVar2 = TPZStackEqnStorage<std::complex<float>_>::ClassId(in_stack_fffffffffffe04e0);
  TPZFrontNonSym<std::complex<float>_>::TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<float>_> *)CONCAT44(uVar1,iVar2));
  iVar3 = TPZFrontNonSym<std::complex<float>_>::ClassId(in_stack_fffffffffffe04f0);
  TPZFrontNonSym<std::complex<float>_>::~TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<float>_> *)0x1cf1426);
  TPZStackEqnStorage<std::complex<float>_>::~TPZStackEqnStorage
            ((TPZStackEqnStorage<std::complex<float>_> *)0x1cf1433);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 << 2 ^ iVar3 << 3;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}